

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

bool __thiscall
CommandLineArguments::SetOutputType(CommandLineArguments *this,int ac,char **av,int *i)

{
  undefined1 uVar1;
  SimpleString *this_00;
  long in_RDI;
  SimpleString outputType;
  undefined2 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5a;
  undefined1 in_stack_ffffffffffffff5b;
  undefined1 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5d;
  undefined1 in_stack_ffffffffffffff5e;
  byte bVar2;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff5f;
  SimpleString *in_stack_ffffffffffffff60;
  SimpleString *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  byte bVar4;
  char **in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined1 local_1;
  
  SimpleString::SimpleString
            (in_stack_ffffffffffffff60,
             (char *)CONCAT17(in_stack_ffffffffffffff5f,
                              CONCAT16(in_stack_ffffffffffffff5e,
                                       CONCAT15(in_stack_ffffffffffffff5d,
                                                CONCAT14(in_stack_ffffffffffffff5c,
                                                         CONCAT13(in_stack_ffffffffffffff5b,
                                                                  CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,
                                                  in_stack_ffffffffffffff58)))))));
  getParameterField((CommandLineArguments *)
                    CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
                    (int *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98);
  SimpleString::~SimpleString((SimpleString *)0x21d68c);
  this_00 = (SimpleString *)SimpleString::size((SimpleString *)0x21d696);
  if (this_00 == (SimpleString *)0x0) {
    local_1 = false;
  }
  else {
    bVar4 = 0;
    SimpleString::SimpleString
              (this_00,(char *)CONCAT17(in_stack_ffffffffffffff5f,
                                        CONCAT16(in_stack_ffffffffffffff5e,
                                                 CONCAT15(in_stack_ffffffffffffff5d,
                                                          CONCAT14(in_stack_ffffffffffffff5c,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           in_stack_ffffffffffffff58)))))));
    uVar1 = operator==(this_00,(SimpleString *)
                               CONCAT17(in_stack_ffffffffffffff5f,
                                        CONCAT16(in_stack_ffffffffffffff5e,
                                                 CONCAT15(in_stack_ffffffffffffff5d,
                                                          CONCAT14(in_stack_ffffffffffffff5c,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           in_stack_ffffffffffffff58)))))));
    bVar2 = true;
    if (!(bool)uVar1) {
      SimpleString::SimpleString
                (this_00,(char *)CONCAT17(uVar1,CONCAT16(1,CONCAT15(in_stack_ffffffffffffff5d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    in_stack_ffffffffffffff58)))))))
      ;
      bVar4 = 1;
      in_stack_ffffffffffffff5d =
           operator==(this_00,(SimpleString *)
                              CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffff5d,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    in_stack_ffffffffffffff58)))))))
      ;
      bVar2 = in_stack_ffffffffffffff5d;
    }
    uVar3 = bVar2;
    if ((bVar4 & 1) != 0) {
      SimpleString::~SimpleString((SimpleString *)0x21d77d);
    }
    SimpleString::~SimpleString((SimpleString *)0x21d787);
    if ((bVar2 & 1) == 0) {
      SimpleString::SimpleString
                (this_00,(char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffff5d,
                                                                        CONCAT14(bVar2,CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           in_stack_ffffffffffffff58)))))));
      bVar4 = operator==(this_00,(SimpleString *)
                                 CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffff5d,
                                                                        CONCAT14(bVar2,CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           in_stack_ffffffffffffff58)))))));
      SimpleString::~SimpleString((SimpleString *)0x21d826);
      if ((bVar4 & 1) == 0) {
        SimpleString::SimpleString
                  (this_00,(char *)CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffff5d,
                                                                          CONCAT14(bVar2,CONCAT13(
                                                  bVar4,CONCAT12(in_stack_ffffffffffffff5a,
                                                                 in_stack_ffffffffffffff58)))))));
        bVar2 = operator==(this_00,(SimpleString *)
                                   CONCAT17(uVar1,CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffff5d,
                                                                          CONCAT14(bVar2,CONCAT13(
                                                  bVar4,CONCAT12(in_stack_ffffffffffffff5a,
                                                                 in_stack_ffffffffffffff58)))))));
        SimpleString::~SimpleString((SimpleString *)0x21d8a0);
        if ((bVar2 & 1) == 0) {
          local_1 = false;
        }
        else {
          *(undefined4 *)(in_RDI + 0x38) = 2;
          local_1 = true;
        }
      }
      else {
        *(undefined4 *)(in_RDI + 0x38) = 1;
        local_1 = true;
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x38) = 0;
      local_1 = true;
    }
  }
  SimpleString::~SimpleString((SimpleString *)0x21d8fc);
  return local_1;
}

Assistant:

bool CommandLineArguments::SetOutputType(int ac, const char** av, int& i)
{
    SimpleString outputType = getParameterField(ac, av, i, "-o");
    if (outputType.size() == 0) return false;

    if (outputType == "normal" || outputType == "eclipse") {
        outputType_ = OUTPUT_ECLIPSE;
        return true;
    }
    if (outputType == "junit") {
        outputType_ = OUTPUT_JUNIT;
        return true;
    }
    if (outputType == "teamcity") {
        outputType_ = OUTPUT_TEAMCITY;
        return true;
    }

    return false;
}